

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-connect-error-after-write.c
# Opt level: O3

int run_test_tcp_connect_error_after_write(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar2;
  code **ppcVar3;
  int64_t eval_b_2;
  int64_t eval_b_3;
  sockaddr_in addr;
  uv_connect_t connect_req;
  uv_write_t write_req;
  uv_tcp_t conn;
  undefined8 uStack_258;
  code *apcStack_250 [2];
  long local_240;
  long local_238;
  uv_buf_t local_230;
  sockaddr_in local_220;
  uv_connect_t local_210;
  uv_write_t local_1a8;
  uv_tcp_t local_e0;
  
  apcStack_250[0] = (code *)0x1c6f82;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_220);
  local_e0.data = (void *)(long)iVar1;
  local_1a8.data = (void *)0x0;
  if (local_e0.data == (void *)0x0) {
    apcStack_250[0] = (code *)0x1c6fbf;
    local_230 = uv_buf_init("TEST",4);
    apcStack_250[0] = (code *)0x1c6fce;
    puVar2 = uv_default_loop();
    apcStack_250[0] = (code *)0x1c6fde;
    iVar1 = uv_tcp_init(puVar2,&local_e0);
    local_1a8.data = (void *)(long)iVar1;
    local_210.data = (void *)0x0;
    if (local_1a8.data != (void *)0x0) goto LAB_001c71e1;
    apcStack_250[0] = (code *)0x1c702a;
    iVar1 = uv_write(&local_1a8,(uv_stream_t *)&local_e0,&local_230,1,write_cb);
    local_210.data = (void *)(long)iVar1;
    local_240 = -9;
    if (local_210.data != (void *)0xfffffffffffffff7) goto LAB_001c71f3;
    apcStack_250[0] = (code *)0x1c7068;
    iVar1 = uv_tcp_connect(&local_210,&local_e0,(sockaddr *)&local_220,connect_cb);
    local_240 = (long)iVar1;
    local_238 = 0;
    if (local_240 != 0) goto LAB_001c7202;
    apcStack_250[0] = (code *)0x1c70ae;
    iVar1 = uv_write(&local_1a8,(uv_stream_t *)&local_e0,&local_230,1,write_cb);
    local_240 = (long)iVar1;
    local_238 = 0;
    if (local_240 != 0) goto LAB_001c7211;
    apcStack_250[0] = (code *)0x1c70d3;
    puVar2 = uv_default_loop();
    apcStack_250[0] = (code *)0x1c70dd;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    local_240 = (long)iVar1;
    local_238 = 0;
    if (local_240 != 0) goto LAB_001c7220;
    local_240 = 1;
    local_238 = (long)connect_cb_called;
    if (local_238 != 1) goto LAB_001c722f;
    local_240 = 1;
    local_238 = (long)write_cb_called;
    if (local_238 != 1) goto LAB_001c723e;
    local_240 = 1;
    local_238 = (long)close_cb_called;
    if (local_238 == 1) {
      apcStack_250[0] = (code *)0x1c7171;
      puVar2 = uv_default_loop();
      apcStack_250[0] = (code *)0x1c7185;
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      apcStack_250[0] = (code *)0x1c718f;
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_240 = 0;
      apcStack_250[0] = (code *)0x1c719d;
      puVar2 = uv_default_loop();
      apcStack_250[0] = (code *)0x1c71a5;
      iVar1 = uv_loop_close(puVar2);
      local_238 = (long)iVar1;
      if (local_240 == local_238) {
        apcStack_250[0] = (code *)0x1c71c1;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001c725c;
    }
  }
  else {
    apcStack_250[0] = (code *)0x1c71e1;
    run_test_tcp_connect_error_after_write_cold_1();
LAB_001c71e1:
    apcStack_250[0] = (code *)0x1c71f3;
    run_test_tcp_connect_error_after_write_cold_2();
LAB_001c71f3:
    apcStack_250[0] = (code *)0x1c7202;
    run_test_tcp_connect_error_after_write_cold_3();
LAB_001c7202:
    apcStack_250[0] = (code *)0x1c7211;
    run_test_tcp_connect_error_after_write_cold_4();
LAB_001c7211:
    apcStack_250[0] = (code *)0x1c7220;
    run_test_tcp_connect_error_after_write_cold_5();
LAB_001c7220:
    apcStack_250[0] = (code *)0x1c722f;
    run_test_tcp_connect_error_after_write_cold_6();
LAB_001c722f:
    apcStack_250[0] = (code *)0x1c723e;
    run_test_tcp_connect_error_after_write_cold_7();
LAB_001c723e:
    apcStack_250[0] = (code *)0x1c724d;
    run_test_tcp_connect_error_after_write_cold_8();
  }
  apcStack_250[0] = (code *)0x1c725c;
  run_test_tcp_connect_error_after_write_cold_9();
LAB_001c725c:
  iVar1 = (int)&local_238;
  apcStack_250[0] = write_cb;
  run_test_tcp_connect_error_after_write_cold_10();
  apcStack_250[0] = (code *)(long)iVar1;
  uStack_258 = 0;
  if ((long)apcStack_250[0] < 0) {
    write_cb_called = write_cb_called + 1;
    return iVar1;
  }
  ppcVar3 = apcStack_250;
  iVar1 = (int)&uStack_258;
  write_cb_cold_1();
  if (iVar1 < 0) {
    connect_cb_called = connect_cb_called + 1;
    uv_close((uv_handle_t *)ppcVar3[10],close_cb);
    return extraout_EAX;
  }
  connect_cb_cold_1();
  close_cb_called = close_cb_called + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(tcp_connect_error_after_write) {
#ifdef _WIN32
  RETURN_SKIP("This test is disabled on Windows for now. "
              "See https://github.com/joyent/libuv/issues/444\n");
#else

  uv_connect_t connect_req;
  struct sockaddr_in addr;
  uv_write_t write_req;
  uv_tcp_t conn;
  uv_buf_t buf;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  buf = uv_buf_init("TEST", 4);

  r = uv_tcp_init(uv_default_loop(), &conn);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT_EQ(r, UV_EBADF);

  r = uv_tcp_connect(&connect_req,
                     &conn,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_write(&write_req, (uv_stream_t*)&conn, &buf, 1, write_cb);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}